

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

bool BasicBlock::IsLegalForPathDepBranches(Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  IRKind IVar3;
  LabelInstr *pLVar4;
  BranchInstr *this;
  undefined4 *puVar5;
  
LAB_003ff78b:
  do {
    if ((LabelInstr *)instr == (LabelInstr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x1244,"((0))","UNREACHED");
      if (bVar2) {
        *puVar5 = 0;
        return false;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    IVar3 = (((LabelInstr *)instr)->super_Instr).m_kind;
    if (IVar3 != InstrKindBranch) {
      if ((IVar3 == InstrKindLabel) || (IVar3 == InstrKindProfiledLabel)) {
LAB_003ff7c1:
        pLVar4 = IR::Instr::AsLabelInstr(instr);
        if ((pLVar4->field_0x78 & 1) != 0) {
          return false;
        }
        IVar3 = (((LabelInstr *)instr)->super_Instr).m_kind;
      }
      else {
        bVar2 = IsLegalOpcodeForPathDepBrFold(instr);
        if (!bVar2) {
          return false;
        }
        IVar3 = (((LabelInstr *)instr)->super_Instr).m_kind;
        if ((IVar3 == InstrKindProfiledLabel) || (IVar3 == InstrKindLabel)) goto LAB_003ff7c1;
      }
      if (IVar3 != InstrKindBranch) {
        instr = (((LabelInstr *)instr)->super_Instr).m_next;
        goto LAB_003ff78b;
      }
    }
    this = IR::Instr::AsBranchInstr(instr);
    bVar2 = IR::BranchInstr::IsUnconditional(this);
    if (!bVar2) {
      return true;
    }
    instr = &this->m_branchTarget->super_Instr;
    if ((LabelInstr *)instr == (LabelInstr *)0x0) {
      return false;
    }
  } while( true );
}

Assistant:

bool
BasicBlock::IsLegalForPathDepBranches(IR::Instr* instr)
{
    while (instr)
    {
        if (!instr->IsBranchInstr() && !instr->IsLabelInstr() && !IsLegalOpcodeForPathDepBrFold(instr))
        {
            return false;
        }
        if (instr->IsLabelInstr())
        {
            if (instr->AsLabelInstr()->m_isLoopTop)
            {
                // don't cross over to loops
                return false;
            }
        }
        if (instr->IsBranchInstr())
        {
            IR::BranchInstr* branch = instr->AsBranchInstr();
            if (branch->IsUnconditional())
            {
                if (!branch->GetTarget())
                {
                    return false;
                }
                instr = branch->GetTarget();
            }
            else
            {
                // Found only legal instructions until a conditional branch, build expensive data structures and check provability
                return true;
            }
        }
        else
        {
            instr = instr->m_next;
        }
    }

    Assert(UNREACHED);
    return false;
}